

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O2

int Am_Font_Data::remove(char *__filename)

{
  Am_Font_Data *pAVar1;
  Am_Font_Data **ppAVar2;
  Am_Font_Data **ppAVar3;
  
  ppAVar3 = &list;
  ppAVar2 = (Am_Font_Data **)(Am_Font_Data *)0x0;
  do {
    pAVar1 = *ppAVar3;
    if (pAVar1 == (Am_Font_Data *)0x0) {
LAB_0027e31c:
      return (int)ppAVar2;
    }
    if (pAVar1 == (Am_Font_Data *)__filename) {
      if ((Am_Font_Data *)ppAVar2 == (Am_Font_Data *)0x0) {
        ppAVar2 = &list;
      }
      else {
        ppAVar2 = &((Am_Font_Data *)ppAVar2)->next;
      }
      (((Am_Font_Data *)ppAVar2)->super_Am_Wrapper).super_Am_Registered_Type.
      _vptr_Am_Registered_Type = (_func_int **)pAVar1->next;
      goto LAB_0027e31c;
    }
    ppAVar3 = &pAVar1->next;
    ppAVar2 = (Am_Font_Data **)pAVar1;
  } while( true );
}

Assistant:

void
Am_Font_Data::remove(Am_Font_Data *font)
{
  Am_Font_Data *prev = nullptr;
  Am_Font_Data *curr = list;
  while (curr) {
    if (curr == font) {
      if (prev)
        prev->next = curr->next;
      else
        list = curr->next;
      return;
    }
    prev = curr;
    curr = curr->next;
  }
}